

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_menu_begin_image(nk_context *ctx,char *id,nk_image img,nk_vec2 size)

{
  nk_window *win;
  nk_widget_layout_states nVar1;
  int iVar2;
  nk_context *in;
  nk_rect header;
  nk_rect local_38;
  nk_vec2 local_28;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x437a,
                  "int nk_menu_begin_image(struct nk_context *, const char *, struct nk_image, struct nk_vec2)"
                 );
  }
  win = ctx->current;
  if (win != (nk_window *)0x0) {
    local_28 = size;
    if (win->layout != (nk_panel *)0x0) {
      nVar1 = nk_widget(&local_38,ctx);
      if (nVar1 != NK_WIDGET_INVALID) {
        if (nVar1 == NK_WIDGET_ROM) {
          in = (nk_context *)0x0;
        }
        else {
          in = (nk_context *)0x0;
          if ((win->layout->flags & 0x1000) == 0) {
            in = ctx;
          }
        }
        iVar2 = nk_do_button_image(&ctx->last_widget_state,&win->buffer,local_38,img,
                                   NK_BUTTON_DEFAULT,&(ctx->style).menu_button,&in->input);
        nVar1 = nk_menu_begin(ctx,win,id,(uint)(iVar2 != 0),local_38,local_28);
      }
      return nVar1;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x437c,
                  "int nk_menu_begin_image(struct nk_context *, const char *, struct nk_image, struct nk_vec2)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x437b,
                "int nk_menu_begin_image(struct nk_context *, const char *, struct nk_image, struct nk_vec2)"
               );
}

Assistant:

NK_API int
nk_menu_begin_image(struct nk_context *ctx, const char *id, struct nk_image img,
    struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_rect header;
    const struct nk_input *in;
    int is_clicked = nk_false;
    nk_flags state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    state = nk_widget(&header, ctx);
    if (!state) return 0;
    in = (state == NK_WIDGET_ROM || win->layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;
    if (nk_do_button_image(&ctx->last_widget_state, &win->buffer, header,
        img, NK_BUTTON_DEFAULT, &ctx->style.menu_button, in))
        is_clicked = nk_true;
    return nk_menu_begin(ctx, win, id, is_clicked, header, size);
}